

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields_test.cc
# Opt level: O0

void __thiscall
RequiredFieldsTest_TestRequired_Test<Edition2023Type>::TestBody
          (RequiredFieldsTest_TestRequired_Test<Edition2023Type> *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_480;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_453;
  undefined1 local_452;
  allocator<char> local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  iterator local_428;
  size_type local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  string_view local_400;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3eb;
  undefined1 local_3ea;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  iterator local_3c0;
  size_type local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  string_view local_398;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_383;
  undefined1 local_382;
  allocator<char> local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  iterator local_358;
  size_type local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  string_view local_330;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31b;
  undefined1 local_31a;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  iterator local_2f0;
  size_type local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  string_view local_2c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b3;
  undefined1 local_2b2;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  iterator local_288;
  size_type local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string_view local_260;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_24b;
  undefined1 local_24a;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  iterator local_220;
  size_type local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  string_view local_1f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e5;
  undefined1 local_1e4;
  allocator<char> local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8 [32];
  string local_198 [32];
  iterator local_178;
  size_type local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string_view local_150;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13c;
  undefined1 local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  iterator local_f0;
  size_type local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  string_view local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string_view local_98;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_86;
  undefined1 local_85;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string_view local_20;
  RequiredFieldsTest_TestRequired_Test<Edition2023Type> *local_10;
  RequiredFieldsTest_TestRequired_Test<Edition2023Type> *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"{}");
  local_85 = 1;
  local_70 = &local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"required_message",&local_71);
  local_85 = 0;
  local_48 = &local_68;
  local_40 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_86);
  __l_07._M_len = local_40;
  __l_07._M_array = local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,__l_07,&local_86);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_20,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_86);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  do {
    local_480 = local_480 + -1;
    std::__cxx11::string::~string((string *)local_480);
  } while (local_480 != &local_68);
  std::allocator<char>::~allocator(&local_71);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,"{\"required_message\": {}}");
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_98,&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,"\n      {\n        \"optional_message\": {}\n      }\n      ");
  local_13b = 1;
  local_138 = &local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"required_message",&local_139);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"optional_message.required_message",&local_13a);
  local_13b = 0;
  local_f0 = &local_130;
  local_e8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_13c);
  __l_06._M_len = local_e8;
  __l_06._M_array = local_f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l_06,&local_13c);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_c8,&local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_13c);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
  do {
    local_4c8 = local_4c8 + -1;
    std::__cxx11::string::~string((string *)local_4c8);
  } while (local_4c8 != &local_130);
  std::allocator<char>::~allocator(&local_13a);
  std::allocator<char>::~allocator(&local_139);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_150,
             "\n      {\n        \"optional_message\": {\n          \"repeated_message\": [\n            {\"required_int32\": 1},\n            {},\n            {\"required_int32\": 2}\n          ]\n        }\n      }\n      "
            );
  local_1e4 = 1;
  local_1e0 = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"required_message",&local_1e1);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"optional_message.required_message",&local_1e2);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"optional_message.repeated_message[1].required_int32",&local_1e3);
  local_1e4 = 0;
  local_178 = &local_1d8;
  local_170 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1e5);
  __l_05._M_len = local_170;
  __l_05._M_array = local_178;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_05,&local_1e5);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_150,&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1e5);
  local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_518 = local_518 + -1;
    std::__cxx11::string::~string((string *)local_518);
  } while (local_518 != &local_1d8);
  std::allocator<char>::~allocator(&local_1e3);
  std::allocator<char>::~allocator(&local_1e2);
  std::allocator<char>::~allocator(&local_1e1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f8,
             "\n      {\n        \"required_message\": {},\n        \"map_int32_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
            );
  local_24a = 1;
  local_248 = &local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"map_int32_message[5].required_int32",&local_249);
  local_24a = 0;
  local_220 = &local_240;
  local_218 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_24b);
  __l_04._M_len = local_218;
  __l_04._M_array = local_220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,__l_04,&local_24b);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_1f8,&local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_24b);
  local_548 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220;
  do {
    local_548 = local_548 + -1;
    std::__cxx11::string::~string((string *)local_548);
  } while (local_548 != &local_240);
  std::allocator<char>::~allocator(&local_249);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_260,
             "\n      {\n        \"required_message\": {},\n        \"map_int64_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
            );
  local_2b2 = 1;
  local_2b0 = &local_2a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"map_int64_message[5].required_int32",&local_2b1);
  local_2b2 = 0;
  local_288 = &local_2a8;
  local_280 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2b3);
  __l_03._M_len = local_280;
  __l_03._M_array = local_288;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_278,__l_03,&local_2b3);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_260,&local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2b3);
  local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288;
  do {
    local_578 = local_578 + -1;
    std::__cxx11::string::~string((string *)local_578);
  } while (local_578 != &local_2a8);
  std::allocator<char>::~allocator(&local_2b1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2c8,
             "\n      {\n        \"required_message\": {},\n        \"map_uint32_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
            );
  local_31a = 1;
  local_318 = &local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"map_uint32_message[5].required_int32",&local_319);
  local_31a = 0;
  local_2f0 = &local_310;
  local_2e8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_31b);
  __l_02._M_len = local_2e8;
  __l_02._M_array = local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e0,__l_02,&local_31b);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_2c8,&local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_31b);
  local_5a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f0;
  do {
    local_5a8 = local_5a8 + -1;
    std::__cxx11::string::~string((string *)local_5a8);
  } while (local_5a8 != &local_310);
  std::allocator<char>::~allocator(&local_319);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_330,
             "\n      {\n        \"required_message\": {},\n        \"map_uint64_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
            );
  local_382 = 1;
  local_380 = &local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"map_uint64_message[5].required_int32",&local_381);
  local_382 = 0;
  local_358 = &local_378;
  local_350 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_383);
  __l_01._M_len = local_350;
  __l_01._M_array = local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_348,__l_01,&local_383);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_330,&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_348);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_383);
  local_5d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358;
  do {
    local_5d8 = local_5d8 + -1;
    std::__cxx11::string::~string((string *)local_5d8);
  } while (local_5d8 != &local_378);
  std::allocator<char>::~allocator(&local_381);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_398,
             "\n      {\n        \"required_message\": {},\n        \"map_bool_message\": {\n          \"false\": {\"required_int32\": 1},\n          \"true\": {}\n        }\n      }\n      "
            );
  local_3ea = 1;
  local_3e8 = &local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"map_bool_message[true].required_int32",&local_3e9);
  local_3ea = 0;
  local_3c0 = &local_3e0;
  local_3b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_3eb);
  __l_00._M_len = local_3b8;
  __l_00._M_array = local_3c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3b0,__l_00,&local_3eb);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_398,&local_3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_3eb);
  local_608 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0;
  do {
    local_608 = local_608 + -1;
    std::__cxx11::string::~string((string *)local_608);
  } while (local_608 != &local_3e0);
  std::allocator<char>::~allocator(&local_3e9);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_400,
             "\n      {\n        \"required_message\": {},\n        \"map_string_message\": {\n          \"abc\": {\"required_int32\": 1},\n          \"d\\\"ef\": {}\n        }\n      }\n      "
            );
  local_452 = 1;
  local_450 = &local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"map_string_message[\"d\\\"ef\"].required_int32",&local_451);
  local_452 = 0;
  local_428 = &local_448;
  local_420 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_453);
  __l._M_len = local_420;
  __l._M_array = local_428;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_418,__l,&local_453);
  RequiredFieldsTest<Edition2023Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Edition2023Type>,local_400,&local_418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_453);
  local_638 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428;
  do {
    local_638 = local_638 + -1;
    std::__cxx11::string::~string((string *)local_638);
  } while (local_638 != &local_448);
  std::allocator<char>::~allocator(&local_451);
  return;
}

Assistant:

TYPED_TEST(RequiredFieldsTest, TestRequired) {
  TestFixture::CheckRequired(R"json({})json", {"required_message"});
  TestFixture::CheckRequired(R"json({"required_message": {}})json", {});
  TestFixture::CheckRequired(
      R"json(
      {
        "optional_message": {}
      }
      )json",
      {"required_message", "optional_message.required_message"});

  // Repeated field.
  TestFixture::CheckRequired(
      R"json(
      {
        "optional_message": {
          "repeated_message": [
            {"required_int32": 1},
            {},
            {"required_int32": 2}
          ]
        }
      }
      )json",
      {"required_message", "optional_message.required_message",
       "optional_message.repeated_message[1].required_int32"});

  // Int32 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_int32_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_int32_message[5].required_int32"});

  // Int64 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_int64_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_int64_message[5].required_int32"});

  // Uint32 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_uint32_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_uint32_message[5].required_int32"});

  // Uint64 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_uint64_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_uint64_message[5].required_int32"});

  // Bool map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_bool_message": {
          "false": {"required_int32": 1},
          "true": {}
        }
      }
      )json",
      {"map_bool_message[true].required_int32"});

  // String map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_string_message": {
          "abc": {"required_int32": 1},
          "d\"ef": {}
        }
      }
      )json",
      {R"(map_string_message["d\"ef"].required_int32)"});
}